

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void session(socket *socket,shared_ptr<KeyValueStore> *k)

{
  error_code ec_00;
  bool bVar1;
  error_category *peVar2;
  undefined8 uVar3;
  undefined8 in_RDI;
  exception *e;
  size_t bytes_read;
  char data [24];
  error_code ec;
  error_code *in_stack_fffffffffffffef8;
  system_error *in_stack_ffffffffffffff00;
  mutable_buffers_1 *in_stack_ffffffffffffff08;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *in_stack_ffffffffffffff10;
  misc_errors e_00;
  error_code *in_stack_ffffffffffffff20;
  error_code local_20 [2];
  
  e_00 = (misc_errors)((ulong)in_RDI >> 0x20);
  boost::system::error_code::error_code((error_code *)in_stack_ffffffffffffff00);
  boost::asio::buffer<char,24ul>((char (*) [24])0x146b7d);
  peVar2 = (error_category *)
           boost::asio::
           basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
           ::read_some<boost::asio::mutable_buffers_1>
                     (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                      (error_code *)in_stack_ffffffffffffff00);
  boost::system::error_code::error_code<boost::asio::error::misc_errors>
            (in_stack_ffffffffffffff20,e_00,peVar2);
  bVar1 = boost::system::operator==
                    ((error_code *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if ((!bVar1) && (bVar1 = boost::system::error_code::operator_cast_to_bool(local_20), bVar1)) {
    uVar3 = __cxa_allocate_exception(0x40);
    ec_00.cat_ = peVar2;
    ec_00.val_ = (int)uVar3;
    ec_00.failed_ = (bool)(char)((ulong)uVar3 >> 0x20);
    ec_00._5_3_ = (int3)((ulong)uVar3 >> 0x28);
    boost::system::system_error::system_error(in_stack_ffffffffffffff00,ec_00);
    __cxa_throw(uVar3,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  return;
}

Assistant:

void session(tcp::socket socket, const std::shared_ptr<KeyValueStore>& k) {
  boost::system::error_code ec;
  try {
    for (;;) {
      char data[Packet::HEADER_LENGTH] = { 0 };
      size_t bytes_read = socket.read_some(boost::asio::buffer(data), ec);
      if (ec == boost::asio::error::eof) {
        return;
      } else if (ec) {
        throw boost::system::system_error(ec);
      } else if (data[0] != Packet::MAGIC ||
                 bytes_read < Packet::HEADER_LENGTH) {
        return;
      }
      Packet(data, socket, k);
    }
  } catch (std::exception& e) {
    std::cerr << "Exception in thread: " << e.what() << std::endl;
  }
}